

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O1

void __thiscall icu_63::UnifiedCache::_runEvictionSlice(UnifiedCache *this)

{
  SharedObject *value;
  UBool UVar1;
  int32_t iVar2;
  UHashElement *element;
  int iVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  iVar2 = uhash_count_63(this->fHashtable);
  iVar3 = (this->fMaxPercentageOfInUse * this->fNumValuesInUse) / 100;
  if (iVar3 <= this->fMaxUnused) {
    iVar3 = this->fMaxUnused;
  }
  iVar3 = iVar2 - (iVar3 + this->fNumValuesInUse);
  if (0 < iVar3) {
    iVar4 = 9;
    do {
      element = _nextElement(this);
      if (element == (UHashElement *)0x0) {
        bVar6 = true;
      }
      else {
        UVar1 = _isEvictable(this,element);
        if (UVar1 == '\0') {
          bVar6 = false;
        }
        else {
          value = (SharedObject *)(element->value).pointer;
          uhash_removeElement_63(this->fHashtable,element);
          removeSoftRef(this,value);
          this->fAutoEvictedCount = this->fAutoEvictedCount + 1;
          iVar3 = iVar3 + -1;
          bVar6 = iVar3 == 0;
        }
      }
      bVar5 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while ((!bVar6) && (bVar5));
  }
  return;
}

Assistant:

void UnifiedCache::_runEvictionSlice() const {
    int32_t maxItemsToEvict = _computeCountOfItemsToEvict();
    if (maxItemsToEvict <= 0) {
        return;
    }
    for (int32_t i = 0; i < MAX_EVICT_ITERATIONS; ++i) {
        const UHashElement *element = _nextElement();
        if (element == nullptr) {
            break;
        }
        if (_isEvictable(element)) {
            const SharedObject *sharedObject =
                    (const SharedObject *) element->value.pointer;
            uhash_removeElement(fHashtable, element);
            removeSoftRef(sharedObject);   // Deletes sharedObject when SoftRefCount goes to zero.
            ++fAutoEvictedCount;
            if (--maxItemsToEvict == 0) {
                break;
            }
        }
    }
}